

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void * rw::mustmalloc_h(size_t sz,uint32 hint)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  
  pvVar1 = (void *)(*Engine::memfuncs)(sz,CONCAT44(in_register_00000034,hint));
  if (sz == 0 || pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  fwrite("Error: out of memory\n",0x15,1,_stderr);
  exit(1);
}

Assistant:

void *mustmalloc_h(size_t sz, uint32 hint)
{
	void *ret;
	ret = Engine::memfuncs.rwmalloc(sz, hint);
	if(ret || sz == 0)
		return ret;
	fprintf(stderr, "Error: out of memory\n");
	exit(1);
	return nil;
}